

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::i64_Store16(w3Interp *this)

{
  uint64_t uVar1;
  undefined2 *puVar2;
  
  uVar1 = w3Stack::pop_u64(&this->super_w3Stack);
  puVar2 = (undefined2 *)LoadStore(this,2);
  *puVar2 = (short)uVar1;
  return;
}

Assistant:

INTERP (i64_Store16)
{
    const uint64_t a = pop_u64 ();
    *(uint16_t*)LoadStore (2) = (uint16_t)(a & 0xFFFF);
}